

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

e_int32 calc_slot_hat(OPLL_SLOT *slot,e_int32 pgout_cym,e_uint32 noise)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = 0;
  if (slot->egout < 0xff) {
    uVar1 = slot->pgout;
    iVar2 = (int)DB2LIN_TABLE
                 [slot->egout +
                  ((uint)(((uVar1 >> 2 | uVar1 >> 8 ^ uVar1 >> 1) & 1) !=
                         ((uint)((pgout_cym & 0x10U) == 0) & (uint)pgout_cym >> 2)) << 9 |
                  (uint)(noise == 0) << 6) + 0x40];
  }
  return iVar2;
}

Assistant:

INLINE static e_int32
calc_slot_hat (OPLL_SLOT *slot, e_int32 pgout_cym, e_uint32 noise)
{
  e_uint32 dbout;

  if (slot->egout >= (DB_MUTE - 1)) 
    return 0;
  else if( 
      /* the same as fmopl.c */
      ((BIT(slot->pgout,PG_BITS-8)^BIT(slot->pgout,PG_BITS-1))|BIT(slot->pgout,PG_BITS-7)) ^
      /* different from fmopl.c */
      (BIT(pgout_cym,PG_BITS-7)&!BIT(pgout_cym,PG_BITS-5))
    )
  {
    if(noise)
      dbout = DB_NEG(12.0);
    else
      dbout = DB_NEG(24.0);
  }
  else
  {
    if(noise)
      dbout = DB_POS(12.0);
    else
      dbout = DB_POS(24.0);
  }

  return DB2LIN_TABLE[dbout + slot->egout];
}